

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_decompose.cpp
# Opt level: O2

void test_recompose<float>
               (vector<float,_std::allocator<float>_> *data,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *dims,int target_level)

{
  ostream *poVar1;
  timespec end;
  timespec start;
  Recomposer<float> recomposer;
  timespec local_98;
  timespec local_88;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_78;
  Recomposer<float> local_60;
  
  clock_gettime(0,&local_88);
  local_60.default_batch_size = 0x20;
  local_60.data_buffer_size = 0;
  local_60.data = (float *)0x0;
  local_60.data_buffer = (float *)0x0;
  local_60.load_v_buffer = (float *)0x0;
  local_60.correction_buffer = (float *)0x0;
  local_60.level_dims.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.level_dims.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.level_dims.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MGARD::Recomposer<float>::recompose
            (&local_60,
             (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start,dims,(long)target_level,false,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_78);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_78);
  clock_gettime(0,&local_98);
  std::operator<<((ostream *)&std::cout,"Recomposition time: ");
  poVar1 = std::ostream::_M_insert<double>
                     ((double)(local_98.tv_nsec - local_88.tv_nsec) / 1000000000.0 +
                      (double)(local_98.tv_sec - local_88.tv_sec));
  poVar1 = std::operator<<(poVar1,"s");
  std::endl<char,std::char_traits<char>>(poVar1);
  MGARD::Recomposer<float>::~Recomposer(&local_60);
  return;
}

Assistant:

void test_recompose(vector<T>& data, const vector<size_t>& dims, int target_level){
    struct timespec start, end;
    int err = 0;
    err = clock_gettime(CLOCK_REALTIME, &start);
    MGARD::Recomposer<T> recomposer;
    recomposer.recompose(data.data(), dims, target_level);
    err = clock_gettime(CLOCK_REALTIME, &end);
    cout << "Recomposition time: " << (double)(end.tv_sec - start.tv_sec) + (double)(end.tv_nsec - start.tv_nsec)/(double)1000000000 << "s" << endl;
}